

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emptyclass.h
# Opt level: O2

void __thiscall
Hoard::
EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8>
::put(EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8>
      *this,SuperblockType *s)

{
  HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>
  *pHVar1;
  int iVar2;
  
  iVar2 = getFullness(s);
  *(undefined8 *)(s + 0x30) = 0;
  pHVar1 = (this->_available)._item[iVar2];
  *(HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>
    **)(s + 0x38) = pHVar1;
  if (pHVar1 != (HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>
                 *)0x0) {
    *(SuperblockType **)(pHVar1 + 0x30) = s;
  }
  (this->_available)._item[iVar2] = s;
  return;
}

Assistant:

void put (SuperblockType * s) {
      Check<EmptyClass, MyChecker> check (this);

#ifndef NDEBUG
      // Check to verify that this superblock is not already on one of the lists.
      for (int n = 0; n <= EmptinessClasses + 1; n++) {
	auto * p = _available(n);
	while (p) {
	  if (p == s) {
	    abort();
	  }
	  p = p->getNext();
	}
      }
#endif

      // Put on the appropriate available list.
      auto cl = getFullness (s);

      //    printf ("put %x, cl = %d\n", s, cl);
      s->setPrev (0);
      s->setNext (_available(cl));
      if (_available(cl)) {
	_available(cl)->setPrev (s);
      }
      _available(cl) = s;
    }